

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interprocedural.cpp
# Opt level: O2

void __thiscall
dg::pta::LLVMPointerGraphBuilder::addArgumentOperands
          (LLVMPointerGraphBuilder *this,CallInst *CI,PSNode *node)

{
  bool bVar1;
  PSNode *n;
  Use *arg;
  Use *pUVar2;
  iterator_range<const_llvm::Use_*> iVar3;
  
  iVar3 = llvmutils::args(CI);
  for (pUVar2 = iVar3.begin_iterator; pUVar2 != iVar3.end_iterator; pUVar2 = pUVar2 + 0x20) {
    n = tryGetOperand(this,*(Value **)pUVar2);
    if (n != (PSNode *)0x0) {
      bVar1 = SubgraphNode<dg::pta::PSNode>::hasOperand
                        (&node->super_SubgraphNode<dg::pta::PSNode>,n);
      if (!bVar1) {
        SubgraphNode<dg::pta::PSNode>::addOperand<dg::pta::PSNode*,dg::pta::PSNode>
                  (&node->super_SubgraphNode<dg::pta::PSNode>,n);
      }
    }
  }
  return;
}

Assistant:

void LLVMPointerGraphBuilder::addArgumentOperands(const llvm::CallInst &CI,
                                                  PSNode &node) {
    for (const auto &arg : llvmutils::args(CI)) {
        PSNode *operand = tryGetOperand(arg);
        if (operand && !node.hasOperand(operand)) {
            node.addOperand(operand);
        }
    }
}